

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

void alsa_set_stream_state(cubeb_stream_conflict1 *stm,stream_state state)

{
  long lVar1;
  int iVar2;
  undefined4 in_ESI;
  long *in_RDI;
  int r;
  cubeb_conflict1 *ctx;
  
  lVar1 = *in_RDI;
  *(undefined4 *)(in_RDI + 0x16) = in_ESI;
  iVar2 = pthread_cond_broadcast((pthread_cond_t *)(in_RDI + 0x10));
  if (iVar2 == 0) {
    *(undefined4 *)(lVar1 + 0xd0) = 1;
    poll_wake((cubeb_conflict1 *)0x127aff);
    return;
  }
  __assert_fail("r == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                ,0x135,"void alsa_set_stream_state(cubeb_stream *, enum stream_state)");
}

Assistant:

static void
alsa_set_stream_state(cubeb_stream * stm, enum stream_state state)
{
  cubeb * ctx;
  int r;

  ctx = stm->context;
  stm->state = state;
  r = pthread_cond_broadcast(&stm->cond);
  assert(r == 0);
  ctx->rebuild = 1;
  poll_wake(ctx);
}